

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::coap::Coap::SendResponse
          (Error *__return_storage_ptr__,Coap *this,Request *aRequest,Response *aResponse)

{
  size_t __n;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  if ((aResponse->mHeader).mMessageId == 0) {
    (aResponse->mHeader).mMessageId = (aRequest->mHeader).mMessageId;
  }
  Message::GetToken((ByteArray *)&local_40,aRequest);
  __n = 8;
  if ((ulong)((long)local_40._M_impl.super__Vector_impl_data._M_finish -
             (long)local_40._M_impl.super__Vector_impl_data._M_start) < 8) {
    __n = (long)local_40._M_impl.super__Vector_impl_data._M_finish -
          (long)local_40._M_impl.super__Vector_impl_data._M_start;
  }
  *(byte *)&aResponse->mHeader = *(byte *)&aResponse->mHeader & 0xf | (char)__n << 4;
  memcpy((aResponse->mHeader).mToken,local_40._M_impl.super__Vector_impl_data._M_start,__n);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  aResponse->mEndpoint = aRequest->mEndpoint;
  ResponsesCache::Put(&this->mResponsesCache,aResponse);
  Send(__return_storage_ptr__,this,aResponse);
  return __return_storage_ptr__;
}

Assistant:

Error Coap::SendResponse(const Request &aRequest, Response &aResponse)
{
    // Set message id to request's id
    if (aResponse.GetMessageId() == 0)
    {
        aResponse.SetMessageId(aRequest.GetMessageId());
    }

    // Set the token to request's token
    aResponse.SetToken(aRequest.GetToken());

    // Set message info
    aResponse.SetEndpoint(aRequest.GetEndpoint());

    // Enqueue response
    mResponsesCache.Put(aResponse);

    return Send(aResponse);
}